

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::SetVariableRequest>::destruct
          (BasicTypeInfo<dap::SetVariableRequest> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::SetVariableRequest> *this_local;
  
  SetVariableRequest::~SetVariableRequest((SetVariableRequest *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }